

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

int uECC_make_key(uint8_t *public_key,uint8_t *private_key,uECC_Curve curve)

{
  char cVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uECC_word_t uVar6;
  uint uVar7;
  char cVar8;
  long lVar9;
  long lVar10;
  uECC_word_t _private [4];
  uECC_word_t _public [8];
  uECC_word_t local_98 [4];
  uECC_word_t local_78 [9];
  
  lVar9 = 0x40;
  do {
    uVar7 = (int)curve->num_n_bits + 0x3f;
    uVar3 = (int)curve->num_n_bits + 0x7e;
    if (-1 < (int)uVar7) {
      uVar3 = uVar7;
    }
    iVar4 = uECC_generate_random_int(local_98,curve->n,(wordcount_t)(uVar3 >> 6));
    if (iVar4 == 0) {
      return 0;
    }
    uVar6 = EccPoint_compute_public_key(local_78,local_98,curve);
    if (uVar6 != 0) {
      sVar2 = curve->num_n_bits;
      iVar4 = sVar2 + 7;
      iVar5 = sVar2 + 0xe;
      if (-1 < iVar4) {
        iVar5 = iVar4;
      }
      if (0 < sVar2) {
        uVar7 = 0;
        cVar8 = '\x01';
        do {
          uVar7 = ~uVar7 + (iVar5 >> 3);
          private_key[(char)(cVar8 + -1)] =
               (uint8_t)(*(ulong *)((long)local_98 + (ulong)(uVar7 & 0xfffffff8)) >>
                        ((char)uVar7 * '\b' & 0x3fU));
          uVar7 = (uint)cVar8;
          cVar8 = cVar8 + '\x01';
        } while ((int)uVar7 < iVar5 >> 3);
      }
      uVar7 = (uint)curve->num_bytes;
      if ('\0' < curve->num_bytes) {
        lVar9 = (long)(int)uVar7;
        iVar4 = uVar7 * 8;
        lVar10 = 0;
        do {
          iVar4 = iVar4 + -8;
          uVar7 = uVar7 - 1;
          public_key[lVar10] =
               (uint8_t)(*(ulong *)((long)local_78 + (ulong)(uVar7 & 0xfffffff8)) >>
                        ((byte)iVar4 & 0x38));
          lVar10 = lVar10 + 1;
        } while (lVar9 != lVar10);
      }
      cVar8 = curve->num_bytes;
      if (0 < (long)cVar8) {
        cVar1 = curve->num_words;
        uVar7 = (uint)cVar8;
        lVar9 = (long)(int)uVar7;
        iVar4 = uVar7 * 8;
        lVar10 = 0;
        do {
          uVar7 = uVar7 - 1;
          iVar4 = iVar4 + -8;
          public_key[lVar10 + cVar8] =
               (uint8_t)(*(ulong *)((long)local_78 + (ulong)(uVar7 & 0xfffffff8) + (long)cVar1 * 8)
                        >> ((byte)iVar4 & 0x38));
          lVar10 = lVar10 + 1;
        } while (lVar9 != lVar10);
      }
      return 1;
    }
    lVar9 = lVar9 + -1;
  } while (lVar9 != 0);
  return 0;
}

Assistant:

int uECC_make_key(uint8_t *public_key,
                  uint8_t *private_key,
                  uECC_Curve curve) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *_private = (uECC_word_t *)private_key;
    uECC_word_t *_public = (uECC_word_t *)public_key;
#else
    uECC_word_t _private[uECC_MAX_WORDS];
    uECC_word_t _public[uECC_MAX_WORDS * 2];
#endif
    uECC_word_t tries;

    for (tries = 0; tries < uECC_RNG_MAX_TRIES; ++tries) {
        if (!uECC_generate_random_int(_private, curve->n, BITS_TO_WORDS(curve->num_n_bits))) {
            return 0;
        }

        if (EccPoint_compute_public_key(_public, _private, curve)) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
            uECC_vli_nativeToBytes(private_key, BITS_TO_BYTES(curve->num_n_bits), _private);
            uECC_vli_nativeToBytes(public_key, curve->num_bytes, _public);
            uECC_vli_nativeToBytes(
                public_key + curve->num_bytes, curve->num_bytes, _public + curve->num_words);
#endif
            return 1;
        }
    }
    return 0;
}